

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementTetraCorot_4_P::ComputeInternalForces
          (ChElementTetraCorot_4_P *this,ChVectorDynamic<> *Fi)

{
  ChVectorDynamic<> FiK_local;
  ChVectorDynamic<> displ;
  Matrix<double,__1,_1,_0,__1,_1> local_48;
  Matrix<double,__1,_1,_0,__1,_1> local_38;
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_28;
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 4) {
    local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data._0_4_ =
         4;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_38,(int *)&local_48);
    (*(this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase[6])(this,&local_38);
    local_28 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->StiffnessMatrix,
                          (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_38);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_48,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_28);
    local_28.m_lhs = (LhsNested)&DAT_bff0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_48,(Scalar *)&local_28);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (Fi,&local_48);
    Eigen::internal::handmade_aligned_free
              ((void *)CONCAT44(local_48.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data._4_4_,
                                local_48.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data._0_4_));
    Eigen::internal::handmade_aligned_free
              (local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    return;
  }
  __assert_fail("Fi.size() == 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementTetraCorot_4.cpp"
                ,0x1f1,
                "virtual void chrono::fea::ChElementTetraCorot_4_P::ComputeInternalForces(ChVectorDynamic<> &)"
               );
}

Assistant:

void ChElementTetraCorot_4_P::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 4);

    // set up vector of nodal fields
    ChVectorDynamic<> displ(4);
    this->GetStateBlock(displ);

    // [local Internal Forces] = [Klocal] * P
    ChVectorDynamic<> FiK_local = StiffnessMatrix * displ;

    //***TO DO*** derivative terms? + [Rlocal] * P_dt ???? ***NO because Poisson  rho dP/dt + div [C] grad P = 0

    FiK_local *= -1.0;

    // ChMatrixCorotation::ComputeCK(FiK_local, this->A, 4, Fi);  ***corotation NOT NEEDED

    Fi = FiK_local;
}